

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hotel.h
# Opt level: O2

void initializeHotel(Hotel *h)

{
  int i;
  long lVar1;
  long lVar2;
  
  for (lVar1 = 0; lVar2 = 1, lVar1 != 0xc; lVar1 = lVar1 + 1) {
    for (; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      *(undefined4 *)((long)(h->booked_rooms + -1) + 0x78 + lVar2 * 4) = 0;
    }
    h = (Hotel *)(h->booked_rooms[0] + 0x1e);
  }
  return;
}

Assistant:

void initializeHotel(Hotel* h){
    for (int i = 0; i < 12; i++) {
        for (int j = 0; j < 31; j++) {
            h->booked_rooms[i][j] = 0;
        }
    }
    return;
}